

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadialDistrFunc.cpp
# Opt level: O1

void __thiscall OpenMD::RadialDistrFunc::process(RadialDistrFunc *this)

{
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *pvVar1;
  SelectionManager *sman2;
  SelectionManager *sman1;
  int iVar2;
  long lVar3;
  vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *pvVar4;
  SelectionManager *sman2_00;
  uint uVar5;
  ulong uVar6;
  DumpReader reader;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_1478;
  vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *local_1458;
  SelectionManager *local_1450;
  int local_1444;
  vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *local_1440;
  SelectionManager *local_1438;
  SelectionEvaluator *local_1430;
  SelectionEvaluator *local_1428;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *local_1420;
  vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *local_1418;
  vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *local_1410;
  vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *local_1408;
  vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *local_1400;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *local_13f8;
  vector<int,_std::allocator<int>_> *local_13f0;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *local_13e8;
  vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *local_13e0;
  vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *local_13d8;
  vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *local_13d0;
  vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *local_13c8;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *local_13c0;
  vector<int,_std::allocator<int>_> *local_13b8;
  SelectionManager *local_13b0;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *local_13a8;
  vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_> *local_13a0;
  vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_> *local_1398;
  vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_> *local_1390;
  vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_> *local_1388;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *local_1380;
  vector<int,_std::allocator<int>_> *local_1378;
  SelectionManager *local_1370;
  SelectionManager *local_1368;
  ulong local_1360;
  SelectionManager local_1358;
  DumpReader local_1288;
  
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[4])();
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  local_1444 = DumpReader::getNFrames(&local_1288);
  this->nProcessed_ = local_1444 / (this->super_StaticAnalyser).step_;
  if (0 < local_1444) {
    local_1428 = &this->evaluator1_;
    local_1438 = &this->seleMan1_;
    local_1430 = &this->evaluator2_;
    sman2_00 = &this->seleMan2_;
    local_1450 = &this->common_;
    local_1378 = &(this->common_).nObjects_;
    local_1380 = &(this->common_).stuntdoubles_;
    local_1388 = &(this->common_).bonds_;
    local_1390 = &(this->common_).bends_;
    local_1398 = &(this->common_).torsions_;
    pvVar4 = &local_1358.torsions_;
    local_13a0 = &(this->common_).inversions_;
    local_1458 = &local_1358.inversions_;
    local_13a8 = &(this->common_).molecules_;
    pvVar1 = &local_1358.molecules_;
    local_13b8 = &(this->sele1_minus_common_).nObjects_;
    local_13c0 = &(this->sele1_minus_common_).stuntdoubles_;
    local_13c8 = &(this->sele1_minus_common_).bonds_;
    local_13d0 = &(this->sele1_minus_common_).bends_;
    local_13d8 = &(this->sele1_minus_common_).torsions_;
    local_13e0 = &(this->sele1_minus_common_).inversions_;
    local_13e8 = &(this->sele1_minus_common_).molecules_;
    local_13f0 = &(this->sele2_minus_common_).nObjects_;
    local_13f8 = &(this->sele2_minus_common_).stuntdoubles_;
    local_1400 = &(this->sele2_minus_common_).bonds_;
    local_1408 = &(this->sele2_minus_common_).bends_;
    local_1410 = &(this->sele2_minus_common_).torsions_;
    local_1418 = &(this->sele2_minus_common_).inversions_;
    local_1420 = &(this->sele2_minus_common_).molecules_;
    local_1368 = &this->sele1_minus_common_;
    local_1370 = &this->sele2_minus_common_;
    uVar6 = 0;
    local_1440 = pvVar4;
    local_13b0 = sman2_00;
    do {
      DumpReader::readFrame(&local_1288,(int)uVar6);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->evaluator1_).isDynamic_ == true) {
        SelectionEvaluator::evaluate((SelectionSet *)&local_1358,local_1428);
        lVar3 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan1_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar3
                     ),(vector<bool,_std::allocator<bool>_> *)
                       ((long)&(local_1358.info_)->_vptr_SimInfo + lVar3));
          lVar3 = lVar3 + 0x28;
        } while (lVar3 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
                   &local_1358);
        (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xb])(this,local_1438);
        pvVar4 = local_1440;
      }
      if ((this->evaluator2_).isDynamic_ == true) {
        SelectionEvaluator::evaluate((SelectionSet *)&local_1358,local_1430);
        lVar3 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan2_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar3
                     ),(vector<bool,_std::allocator<bool>_> *)
                       ((long)&(local_1358.info_)->_vptr_SimInfo + lVar3));
          lVar3 = lVar3 + 0x28;
        } while (lVar3 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)
                   &local_1358);
        (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xc])(this,sman2_00);
        pvVar4 = local_1440;
      }
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[8])(this);
      sman1 = local_1438;
      if (((this->evaluator1_).isDynamic_ != false) || ((this->evaluator2_).isDynamic_ == true)) {
        local_1360 = uVar6;
        operator&(&local_1358,local_1438,sman2_00);
        local_1478.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (this->common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_1478.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (this->common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_1478.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (this->common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        (this->common_).info_ = local_1358.info_;
        (this->common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1358.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        (this->common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1358.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1358.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1358.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1358.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1358.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1478);
        std::vector<int,_std::allocator<int>_>::_M_move_assign(local_1378,&local_1358.nObjects_);
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::_M_move_assign
                  (local_1380,&local_1358.stuntdoubles_);
        std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::_M_move_assign
                  (local_1388,&local_1358.bonds_);
        std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::_M_move_assign
                  (local_1390,&local_1358.bends_);
        std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::_M_move_assign
                  (local_1398,pvVar4);
        std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::_M_move_assign
                  (local_13a0,local_1458);
        std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::_M_move_assign
                  (local_13a8,pvVar1);
        SelectionManager::~SelectionManager(&local_1358);
        sman2 = local_1450;
        operator-(&local_1358,sman1,local_1450);
        local_1478.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (this->sele1_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_1478.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (this->sele1_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_1478.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (this->sele1_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        (this->sele1_minus_common_).info_ = local_1358.info_;
        (this->sele1_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1358.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        (this->sele1_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1358.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->sele1_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1358.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1358.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1358.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1358.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1478);
        std::vector<int,_std::allocator<int>_>::_M_move_assign(local_13b8,&local_1358.nObjects_);
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::_M_move_assign
                  (local_13c0,&local_1358.stuntdoubles_);
        std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::_M_move_assign
                  (local_13c8,&local_1358.bonds_);
        std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::_M_move_assign
                  (local_13d0,&local_1358.bends_);
        std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::_M_move_assign
                  (local_13d8,pvVar4);
        std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::_M_move_assign
                  (local_13e0,local_1458);
        std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::_M_move_assign
                  (local_13e8,pvVar1);
        SelectionManager::~SelectionManager(&local_1358);
        sman2_00 = local_13b0;
        operator-(&local_1358,local_13b0,sman2);
        local_1478.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (this->sele2_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        local_1478.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             (this->sele2_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_1478.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (this->sele2_minus_common_).ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        (this->sele2_minus_common_).info_ = local_1358.info_;
        (this->sele2_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_1358.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_start;
        (this->sele2_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1358.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_finish;
        (this->sele2_minus_common_).ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_1358.ss_.bitsets_.
             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
        local_1358.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_1358.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1358.ss_.bitsets_.
        super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1478);
        std::vector<int,_std::allocator<int>_>::_M_move_assign(local_13f0,&local_1358.nObjects_);
        std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::_M_move_assign
                  (local_13f8,&local_1358.stuntdoubles_);
        std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::_M_move_assign
                  (local_1400,&local_1358.bonds_);
        std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::_M_move_assign
                  (local_1408,&local_1358.bends_);
        std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::_M_move_assign
                  (local_1410,pvVar4);
        std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::_M_move_assign
                  (local_1418,local_1458);
        std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::_M_move_assign
                  (local_1420,pvVar1);
        SelectionManager::~SelectionManager(&local_1358);
        iVar2 = OpenMDBitSet::countBits
                          ((this->seleMan1_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        uVar6 = local_1360;
        this->nSelected1_ = iVar2;
        iVar2 = OpenMDBitSet::countBits
                          ((this->seleMan2_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        this->nSelected2_ = iVar2;
        iVar2 = OpenMDBitSet::countBits
                          ((this->common_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        this->nPairs_ = this->nSelected2_ * this->nSelected1_ - ((iVar2 + 1) * iVar2) / 2;
      }
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[6])(this,local_1368,sman2_00);
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[6])(this,local_1450,local_1370);
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[7])(this,local_1450);
      (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[10])(this);
      uVar5 = (int)uVar6 + (this->super_StaticAnalyser).step_;
      uVar6 = (ulong)uVar5;
    } while ((int)uVar5 < local_1444);
  }
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[5])(this);
  (*(this->super_StaticAnalyser)._vptr_StaticAnalyser[0xd])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void RadialDistrFunc::process() {
    preProcess();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();
    nProcessed_ = nFrames / step_;

    for (int i = 0; i < nFrames; i += step_) {
      reader.readFrame(i);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
        validateSelection1(seleMan1_);
      }
      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
        validateSelection2(seleMan2_);
      }

      initializeHistogram();

      // Selections may overlap, and we need a bit of logic to deal
      // with this.
      //
      // |     s1    |
      // | s1 -c | c |
      //         | c | s2 - c |
      //         |    s2      |
      //
      // s1 : Set of StuntDoubles in selection1
      // s2 : Set of StuntDoubles in selection2
      // c  : Intersection of selection1 and selection2
      //
      // When we loop over the pairs, we can divide the looping into 3
      // stages:
      //
      // Stage 1 :     [s1-c]      [s2]
      // Stage 2 :     [c]         [s2 - c]
      // Stage 3 :     [c]         [c]
      // Stages 1 and 2 are completely non-overlapping.
      // Stage 3 is completely overlapping.

      if (evaluator1_.isDynamic() || evaluator2_.isDynamic()) {
        common_             = seleMan1_ & seleMan2_;
        sele1_minus_common_ = seleMan1_ - common_;
        sele2_minus_common_ = seleMan2_ - common_;
        nSelected1_         = seleMan1_.getSelectionCount();
        nSelected2_         = seleMan2_.getSelectionCount();
        int nIntersect      = common_.getSelectionCount();

        nPairs_ = nSelected1_ * nSelected2_ - (nIntersect + 1) * nIntersect / 2;
      }

      processNonOverlapping(sele1_minus_common_, seleMan2_);
      processNonOverlapping(common_, sele2_minus_common_);
      processOverlapping(common_);

      processHistogram();
    }

    postProcess();

    writeRdf();
  }